

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  size_t __n;
  size_t *psVar1;
  uint uVar2;
  StringPtr *pSVar3;
  uchar *__s2;
  size_t sVar4;
  HashBucket *pHVar5;
  size_t sVar6;
  uint hash;
  uint uVar7;
  int iVar8;
  undefined8 in_RAX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  ulong targetSize;
  Maybe<unsigned_long> *result;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar14;
  Maybe<unsigned_long> MVar15;
  Maybe<unsigned_long> MVar16;
  ArrayPtr<const_unsigned_char> s_00;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
    MVar16.ptr.field_1.value = pos;
    MVar16.ptr._0_8_ = in_RAX;
    return (Maybe<unsigned_long>)MVar16.ptr;
  }
  pSVar3 = (table->rows).builder.ptr;
  lVar13 = (long)(table->rows).builder.pos - (long)pSVar3;
  __s2 = (uchar *)(row->content).ptr;
  sVar4 = (row->content).size_;
  uVar12 = (table->indexes).buckets.size_ * 2;
  if (uVar12 < ((lVar13 >> 4) + (table->indexes).erasedCount) * 3 + 3) {
    targetSize = (lVar13 >> 3) + 2;
    if (targetSize < uVar12) {
      targetSize = uVar12;
    }
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&table->indexes,targetSize);
  }
  __n = sVar4 - 1;
  s_00.size_ = __n;
  s_00.ptr = __s2;
  hash = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_00);
  uVar7 = _::chooseBucket(hash,(uint)(table->indexes).buckets.size_);
  pHVar5 = (table->indexes).buckets.ptr;
  sVar6 = (table->indexes).buckets.size_;
  paVar14 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar5 + uVar7);
    uVar2 = *(uint *)((long)paVar9 + 4);
    if (uVar2 == 1) {
      if (paVar14 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar14 = paVar9;
      }
    }
    else {
      if (uVar2 == 0) {
        if (paVar14 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(table->indexes).erasedCount;
          *psVar1 = *psVar1 - 1;
          paVar9 = paVar14;
        }
        aVar10.value = ((ulong)hash | pos << 0x20) + 0x200000000;
        paVar9->value = (unsigned_long)aVar10;
        *this = (Impl<0UL,_false>)0x0;
        goto LAB_0014092c;
      }
      if (*(uint *)paVar9 == hash) {
        uVar12 = (ulong)(uVar2 - 2);
        if ((pSVar3[uVar12].content.size_ == sVar4) &&
           (iVar8 = bcmp(pSVar3[uVar12].content.ptr,__s2,__n), iVar8 == 0)) {
          *this = (Impl<0UL,_false>)0x1;
          *(ulong *)(this + 8) = uVar12;
          aVar10 = extraout_RDX;
LAB_0014092c:
          MVar15.ptr.field_1.value = aVar10.value;
          MVar15.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar15.ptr;
        }
      }
    }
    sVar11 = (ulong)uVar7 + 1;
    uVar7 = (uint)sVar11;
    if (sVar11 == sVar6) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }